

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

void init_module_trodesnetwork(void)

{
  keyword *pkVar1;
  long lVar2;
  self *this;
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar3;
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar4;
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar5;
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar6;
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *this_00;
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar7;
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar8;
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar9;
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar10;
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar11;
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar12;
  keyword *pkVar13;
  keyword *pkVar14;
  object_base local_138;
  undefined8 local_130;
  init_base<boost::python::init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_128;
  init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_108;
  keyword *local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  keyword local_c0 [19];
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  long *local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  
  PyEval_InitThreads();
  Py_Initialize();
  boost::python::numpy::initialize(true);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::convert,
             (type_info)"St6vectorINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESaIS5_EE",
             boost::python::
             to_python_converter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>_>
             ::convert,(type_info)"St6vectorIhSaIhEE",
             boost::python::
             to_python_converter<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<int,_std::allocator<int>_>,_vecToList<int>_>::convert
             ,(type_info)"St6vectorIiSaIiEE",
             boost::python::
             to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false>::
             get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict>
             ::convert,(type_info)"St6vectorI13EventDataTypeSaIS0_EE",
             boost::python::
             to_python_converter<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>_>
             ::convert,(type_info)"St6vectorI16HighFreqDataTypeSaIS0_EE",
             boost::python::
             to_python_converter<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::as_to_python_function<TrodesMsg,_TrodesMsgToList>::convert,
             (type_info)"9TrodesMsg",
             boost::python::to_python_converter<TrodesMsg,_TrodesMsgToList,_false>::get_pytype_impl)
  ;
  boost::python::converter::registry::insert
            (boost::python::converter::as_to_python_function<lfpPacket,_lfpPacketToList>::convert,
             (type_info)"9lfpPacket",
             boost::python::to_python_converter<lfpPacket,_lfpPacketToList,_false>::get_pytype_impl)
  ;
  pkVar14 = boost::python::detail::current_scope;
  pkVar13 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  local_128.m_keywords.first = pkVar14;
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x361fa6;
  local_128.m_doc = (char *)pkVar13;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[7]>("Trodes");
  boost::python::api::setattr((object *)&local_108,"TRODES_NETWORK_ID",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x361fb8;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[16]>("tcp://127.0.0.1");
  boost::python::api::setattr((object *)&local_108,"DEFAULT_SERVER_ADDRESS",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x361fcf;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<int>(&DEFAULT_SERVER_PORT);
  boost::python::api::setattr((object *)&local_108,"DEFAULT_SERVER_PORT",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x361fe3;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[12]>("neurostream");
  boost::python::api::setattr((object *)&local_108,"NEURALSTREAM",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x361ff0;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[13]>("analogstream");
  boost::python::api::setattr((object *)&local_108,"ANALOGSTREAM",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x361ffd;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[14]>("digitalstream");
  boost::python::api::setattr((object *)&local_108,"DIGITALSTREAM",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x36200b;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[12]>("spikestream");
  boost::python::api::setattr((object *)&local_108,"SPIKESTREAM",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x362017;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[10]>("lfpstream");
  boost::python::api::setattr((object *)&local_108,"LFPSTREAM",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x362021;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[5]>("play");
  boost::python::api::setattr((object *)&local_108,"acq_PLAY",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x36202a;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[5]>("stop");
  boost::python::api::setattr((object *)&local_108,"acq_STOP",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x362033;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[6]>("pause")
  ;
  boost::python::api::setattr((object *)&local_108,"acq_PAUSE",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
    pkVar14 = boost::python::detail::current_scope;
  }
  pkVar13 = pkVar14;
  if (pkVar14 == (keyword *)0x0) {
    pkVar13 = (keyword *)&_Py_NoneStruct;
  }
  lVar2 = *(long *)&pkVar13->field_0x0 + 1;
  *(long *)&pkVar13->field_0x0 = lVar2;
  if (pkVar14 != (keyword *)0x0) {
    lVar2 = *(long *)&pkVar14->field_0x0 + 1;
    *(long *)&pkVar14->field_0x0 = lVar2;
  }
  *(long *)&pkVar13->field_0x0 = lVar2 + 1;
  local_108.m_keywords.first = (keyword *)0x36203d;
  local_128.m_doc = (char *)pkVar13;
  local_128.m_keywords.first = pkVar14;
  local_108.m_doc = (char *)pkVar13;
  local_138.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[5]>("seek");
  boost::python::api::setattr((object *)&local_108,"acq_SEEK",(object *)&local_138);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = pkVar14;
  *(long *)&pkVar13->field_0x0 = *(long *)&pkVar13->field_0x0 + -1;
  if (*(long *)&pkVar13->field_0x0 == 0) {
    _Py_Dealloc(pkVar13);
  }
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_108,"timestamp_t",(char *)0x0);
  this = boost::python::
         class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
         ::add_property<unsigned_int_timestamp_t::*>
                   ((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                     *)&local_108,"trodes_timestamp",0,(char *)0x0);
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::add_property<long_timestamp_t::*>(this,"system_timestamp",8,(char *)0x0);
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  boost::python::def<long(*)()>("systemTimeMSecs",CZHelp::systemTimeMSecs);
  boost::python::
  class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_108,"HighFreqDataType",(char *)0x0);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        ((class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_108,"name",(first_type)HighFreqDataType::getName_abi_cxx11_,0,
                         (char *)HighFreqDataType::setName);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar3,"origin",(first_type)HighFreqDataType::getOrigin_abi_cxx11_,0,
                         (char *)HighFreqDataType::setOrigin);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar3,"dataFormat",(first_type)HighFreqDataType::getDataFormat_abi_cxx11_,
                         0,(char *)HighFreqDataType::setDataFormat);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar3,"address",(first_type)HighFreqDataType::getSockAddr_abi_cxx11_,0,
                         (char *)HighFreqDataType::setSockAddr);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::add_property<int(HighFreqDataType::*)()const,void(HighFreqDataType::*)(int)>
                        (pcVar3,"byteSize",(first_type)HighFreqDataType::getByteSize,0,
                         (char *)HighFreqDataType::setByteSize);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(HighFreqDataType::*)()const>
                        (pcVar3,"isValid",(first_type)HighFreqDataType::isValid);
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(HighFreqDataType::*)()>(pcVar3,"print",(first_type)HighFreqDataType::print);
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_128,"StimulationCommand",&local_108);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int)>
                        ((class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_128,"setGroup",(first_type)StimulationCommand::setGroup);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(StimulationCommand::*)()>
                        (pcVar4,"setNoGroup",(first_type)StimulationCommand::setNoGroup);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int)>
                        (pcVar4,"setSlot",(first_type)StimulationCommand::setSlot);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int,int,int,int)>
                        (pcVar4,"setChannels",(first_type)StimulationCommand::setChannels);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<unsigned_char(StimulationCommand::*)(unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short)>
                        (pcVar4,"setBiphasicPulseShape",
                         (first_type)StimulationCommand::setBiphasicPulseShape);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(StimulationCommand::*)(unsigned_short)>
                        (pcVar4,"setNumPulsesInTrain",
                         (first_type)StimulationCommand::setNumPulsesInTrain);
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)()>(pcVar4,"isValid",(first_type)StimulationCommand::isValid);
  *(long *)local_128.m_doc = *(long *)local_128.m_doc + -1;
  if (*(long *)local_128.m_doc == 0) {
    _Py_Dealloc();
  }
  boost::python::objects::enum_base::enum_base
            ((enum_base *)&local_108,"CurrentScaling",
             boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::to_python,
             boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::
             convertible_from_python,
             boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::construct,
             (type_info)"N25GlobalStimulationSettings14CurrentScalingE",(char *)0x0);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max10nA",0);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max20nA",1);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max50nA",2);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max100nA",3);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max200nA",4);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max500nA",5);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max1uA",6);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max2uA",7);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max5uA",8);
  boost::python::objects::enum_base::add_value((enum_base *)&local_108,"max10uA",9);
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_128,"GlobalStimulationSettings",&local_108);
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationSettings::*)(GlobalStimulationSettings::CurrentScaling)>
            ((class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_128,"setVoltageScale",(first_type)GlobalStimulationSettings::setVoltageScale)
  ;
  *(long *)local_128.m_doc = *(long *)local_128.m_doc + -1;
  if (*(long *)local_128.m_doc == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_128,"GlobalStimulationCommand",&local_108);
  pcVar5 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)(bool)>
                        ((class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_128,"setStimEnabled",
                         (first_type)GlobalStimulationCommand::setStimEnabled);
  pcVar5 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)()>
                        (pcVar5,"setResetSequencer",
                         (first_type)GlobalStimulationCommand::setResetSequencer);
  pcVar5 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)()>
                        (pcVar5,"setAbortStimulation",
                         (first_type)GlobalStimulationCommand::setAbortStimulation);
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)()>
            (pcVar5,"setClearDSPOffset",(first_type)GlobalStimulationCommand::setClearDSPOffset);
  *(long *)local_128.m_doc = *(long *)local_128.m_doc + -1;
  if (*(long *)local_128.m_doc == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  local_128.m_doc = "13HFSubConsumer";
  boost::python::objects::class_base::class_base
            ((class_base *)&local_138,"HFSubConsumer",1,(type_info *)&local_128,(char *)0x0);
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_138,
             (init_base<boost::python::init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_108);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(HFSubConsumer::*)()>
                        ((class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_138,"initialize",0x11);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(boost::python::numpy::ndarray)>
                        (pcVar6,"readData",(first_type)HFSubConsumer_python::readData_python);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar6,"available",(first_type)HFSubConsumer::available);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<HighFreqDataType(HighFreqSub::*)()>
                        (pcVar6,"getDataType",(first_type)HighFreqSub::getType);
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            (pcVar6,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  boost::python::
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_108,"HFParsingInfo",(char *)0x0);
  this_00 = (class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               add_property<std::vector<int,std::allocator<int>>HFParsingInfo::*,std::vector<int,std::allocator<int>>HFParsingInfo::*>
                         ((class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                           *)&local_108,"indices",0,0,(char *)0x0);
  boost::python::
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::add_property<unsigned_long_HFParsingInfo::*,unsigned_long_HFParsingInfo::*>
            (this_00,"sizeOf",0x18,0x18,(char *)0x0);
  *(long *)local_108.m_doc = *(long *)local_108.m_doc + -1;
  if (*(long *)local_108.m_doc == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  local_128.m_doc = "11LFPConsumer";
  local_128.m_keywords.first = (keyword *)0x363b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_138,"LFPConsumer",2,(type_info *)&local_128,(char *)0x0);
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_108);
  pcVar7 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(LFPConsumer::*)()>
                        ((class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_138,"initialize",0x11);
  pcVar7 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(LFPConsumer_python::*)()>
                        (pcVar7,"getData",(first_type)LFPConsumer_python::getData_python);
  pcVar7 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar7,"available",(first_type)HFSubConsumer::available);
  pcVar7 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(LFPConsumer_python::*)()>
                        (pcVar7,"create_numpy_array",
                         (first_type)LFPConsumer_python::create_numpy_array);
  pcVar7 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar7,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(LFPConsumer::*)()const>
            (pcVar7,"getNTrodesRequested",(first_type)LFPConsumer::getNTrodesRequested_abi_cxx11_);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  local_128.m_doc = "14SpikesConsumer";
  local_128.m_keywords.first = (keyword *)0x363b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_138,"SpikesConsumer",2,(type_info *)&local_128,(char *)0x0);
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_108);
  pcVar8 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(SpikesConsumer::*)()>
                        ((class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_138,"initialize",0x11);
  pcVar8 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(SpikesConsumer_python::*)()>
                        (pcVar8,"getData",(first_type)SpikesConsumer_python::getData_python);
  pcVar8 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar8,"available",(first_type)HFSubConsumer::available);
  pcVar8 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(SpikesConsumer_python::*)()>
                        (pcVar8,"create_numpy_array",
                         (first_type)SpikesConsumer_python::create_numpy_array);
  pcVar8 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar8,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(SpikesConsumer::*)()const>
            (pcVar8,"getNTrodesRequested",(first_type)SpikesConsumer::getNTrodesRequested_abi_cxx11_
            );
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  local_128.m_doc = "14AnalogConsumer";
  local_128.m_keywords.first = (keyword *)0x363b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_138,"AnalogConsumer",2,(type_info *)&local_128,(char *)0x0);
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_108);
  pcVar9 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(AnalogConsumer::*)()>
                        ((class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_138,"initialize",0x11);
  pcVar9 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(AnalogConsumer_python::*)()>
                        (pcVar9,"getData",(first_type)AnalogConsumer_python::getData_python);
  pcVar9 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar9,"available",(first_type)HFSubConsumer::available);
  pcVar9 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(AnalogConsumer_python::*)()>
                        (pcVar9,"create_numpy_array",
                         (first_type)AnalogConsumer_python::create_numpy_array);
  pcVar9 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar9,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AnalogConsumer::*)()const>
            (pcVar9,"getChannelsRequested",
             (first_type)AnalogConsumer::getChannelsRequested_abi_cxx11_);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  local_128.m_doc = "15DigitalConsumer";
  local_128.m_keywords.first = (keyword *)0x363b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_138,"AnalogConsumer",2,(type_info *)&local_128,(char *)0x0);
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_108);
  pcVar10 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<void(DigitalConsumer::*)()>
                         ((class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                           *)&local_138,"initialize",0x11);
  pcVar10 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<timestamp_t(DigitalConsumer_python::*)()>
                         (pcVar10,"getData",(first_type)DigitalConsumer_python::getData_python);
  pcVar10 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<unsigned_long(HFSubConsumer::*)(long)>
                         (pcVar10,"available",(first_type)HFSubConsumer::available);
  pcVar10 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<boost::python::numpy::ndarray(DigitalConsumer_python::*)()>
                         (pcVar10,"create_numpy_array",
                          (first_type)DigitalConsumer_python::create_numpy_array);
  pcVar10 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<long(HFSubConsumer::*)()const>
                         (pcVar10,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(DigitalConsumer::*)()const>
            (pcVar10,"getChannelsRequested",
             (first_type)DigitalConsumer::getChannelsRequested_abi_cxx11_);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_108.m_doc = (char *)0x0;
  local_108.m_keywords.first = (keyword *)0x0;
  local_108.m_keywords.second = (keyword *)0x0;
  local_128.m_doc = "14NeuralConsumer";
  local_128.m_keywords.first = (keyword *)0x363b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_138,"NeuralConsumer",2,(type_info *)&local_128,(char *)0x0);
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_108);
  pcVar11 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<void(NeuralConsumer::*)()>
                         ((class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                           *)&local_138,"initialize",0x11);
  pcVar11 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<timestamp_t(NeuralConsumer_python::*)()>
                         (pcVar11,"getData",(first_type)NeuralConsumer_python::getData_python);
  pcVar11 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<unsigned_long(HFSubConsumer::*)(long)>
                         (pcVar11,"available",(first_type)HFSubConsumer::available);
  pcVar11 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<boost::python::numpy::ndarray(NeuralConsumer_python::*)()>
                         (pcVar11,"create_numpy_array",
                          (first_type)NeuralConsumer_python::create_numpy_array);
  pcVar11 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<long(HFSubConsumer::*)()const>
                         (pcVar11,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(NeuralConsumer::*)()const>
            (pcVar11,"getChannelsRequested",
             (first_type)NeuralConsumer::getChannelsRequested_abi_cxx11_);
  (local_138.m_ptr)->ob_refcnt = (local_138.m_ptr)->ob_refcnt + -1;
  if ((local_138.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_128.m_doc = (char *)0x0;
  local_128.m_keywords.first = (keyword *)0x0;
  local_128.m_keywords.second = (keyword *)0x0;
  local_108.m_doc = "20AbstractModuleClient";
  boost::python::objects::class_base::class_base
            ((class_base *)&local_a8,"AbstractModuleClient",1,(type_info *)&local_108,(char *)0x0);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<std::__cxx11::string,std::__cxx11::string,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_a8,&local_128);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(PythonModuleClient::*)()>
                         ((class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
                           *)&local_a8,"closeConnections",
                          (first_type)PythonModuleClient::close_python);
  local_108.m_doc = (char *)&local_30;
  local_30 = PythonModuleClient::default_recv_acquisition;
  local_28 = 0;
  local_138.m_ptr = (PyObject *)0x59;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_acquisition",0x59,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_40;
  local_40 = PythonModuleClient::default_recv_file_open;
  local_38 = 0;
  local_138.m_ptr = (PyObject *)0x49;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_file_open",0x49,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_50;
  local_50 = PythonModuleClient::default_recv_file_close;
  local_48 = 0;
  local_138.m_ptr = (PyObject *)0x51;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(),boost::python::detail::def_helper<void(PythonModuleClient::*)(),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_file_close",0x51,
             (def_helper<void_(PythonModuleClient::*)(),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_60;
  local_60 = PythonModuleClient::default_recv_source;
  local_58 = 0;
  local_138.m_ptr = (PyObject *)0x61;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_source",0x61,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_70;
  local_70 = PythonModuleClient::default_recv_quit;
  local_68 = 0;
  local_138.m_ptr = (PyObject *)0x69;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(),boost::python::detail::def_helper<void(PythonModuleClient::*)(),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_quit",0x69,
             (def_helper<void_(PythonModuleClient::*)(),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_80;
  local_80 = PythonModuleClient::default_recv_time;
  local_78 = 0;
  local_138.m_ptr = (PyObject *)0x71;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_time",0x71,
             (def_helper<void_(PythonModuleClient::*)(unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_90;
  local_90 = PythonModuleClient::default_recv_timerate;
  local_88 = 0;
  local_138.m_ptr = (PyObject *)0x79;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(int),boost::python::detail::def_helper<void(PythonModuleClient::*)(int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_timerate",0x79,
             (def_helper<void_(PythonModuleClient::*)(int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  local_108.m_doc = (char *)&local_a0;
  local_a0 = PythonModuleClient::default_recv_event;
  local_98 = 0;
  local_138.m_ptr = (PyObject *)0x81;
  local_130 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_108.m_keywords.first = local_c0;
  local_108.m_keywords.second = local_c0;
  local_f0 = local_c0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar12,(AbstractModuleClient *)0x0,"recv_event",0x81,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_108,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_138);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)()>(pcVar12,"initialize",(first_type)MlmWrap::initialize);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar12,"subscribeToEvent",
                          (first_type)AbstractModuleClient::subscribeToEvent);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar12,"unsubscribeFromEvent",
                          (first_type)AbstractModuleClient::unsubscribeFromEvent);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar12,"sendMsgToTrodes",
                          (first_type)PythonModuleClient::sendMsgToTrodes_python);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar12,"sendMsgToModule",
                          (first_type)PythonModuleClient::sendMsgToModule_python);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar12,"sendOutEvent",(first_type)PythonModuleClient::sendOutEvent_python
                         );
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar12,"sendTimeRequest",
                          (first_type)AbstractModuleClient::sendTimeRequest);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar12,"sendTimeRateRequest",
                          (first_type)AbstractModuleClient::sendTimeRateRequest);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::__cxx11::string(MlmWrap::*)()const>
                         (pcVar12,"getID",(first_type)MlmWrap::getID_abi_cxx11_);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(MlmWrap::*)()>
                         (pcVar12,"getClients",(first_type)MlmWrap::getClients_abi_cxx11_);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(HighFreqDataType)>
                         (pcVar12,"registerHighFreqData",(first_type)MlmWrap::registerHighFreqData);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(HighFreqDataType)>
                         (pcVar12,"deregisterHighFreqData",
                          (first_type)MlmWrap::deregisterHighFreqData);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>(MlmWrap::*)()>
                         (pcVar12,"getHighFreqList",(first_type)MlmWrap::getHighFreqList);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,unsigned_long),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeHighFreqData",(first_type)PythonModuleClient::subhfd_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_108,&local_108);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeHighFreqData",(first_type)PythonModuleClient::subhfd_default_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_138,&local_138);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar12,"unsubscribeHighFreqData",
                          (first_type)AbstractModuleClient::unsubscribeHighFreqData);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(char_const*)>
                         (pcVar12,"provideEvent",(first_type)MlmWrap::provideEvent);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(char_const*)>
                         (pcVar12,"unprovideEvent",(first_type)MlmWrap::unprovideEvent);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::vector<EventDataType,std::allocator<EventDataType>>(MlmWrap::*)()>
                         (pcVar12,"getEventList",(first_type)MlmWrap::getEventList);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<LFPConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeLFPData",(first_type)PythonModuleClient::sublfpdata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_a9,&local_a9);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<SpikesConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeSpikesData",(first_type)PythonModuleClient::subspikesdata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_aa,&local_aa);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<AnalogConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeAnalogData",(first_type)PythonModuleClient::subanalogdata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_ab,&local_ab);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<DigitalConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeDigitalData",(first_type)PythonModuleClient::subdigitaldata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_ac,&local_ac);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<NeuralConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar12,"subscribeNeuralData",(first_type)PythonModuleClient::subneuraldata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_ad,&local_ad);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string)>
                         (pcVar12,"getAvailableTrodesData",
                          (first_type)AbstractModuleClient::getAvailableTrodesData);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)()>
                         (pcVar12,"initializeHardwareConnection",
                          (first_type)AbstractModuleClient::initializeHardwareConnection);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar12,"destroyHardwareConnection",
                          (first_type)AbstractModuleClient::destroyHardwareConnection);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)()>
                         (pcVar12,"sendSettleCommand",
                          (first_type)AbstractModuleClient::sendSettleCommand);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(StimulationCommand)>
                         (pcVar12,"sendStimulationParams",
                          (first_type)AbstractModuleClient::sendStimulationParams);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar12,"sendClearStimulationParams",
                          (first_type)AbstractModuleClient::sendClearStimulationParams);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar12,"sendStimulationStartSlot",
                          (first_type)AbstractModuleClient::sendStimulationStartSlot);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar12,"sendStimulationStartGroup",
                          (first_type)AbstractModuleClient::sendStimulationStartGroup);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar12,"sendStimulationStopSlot",
                          (first_type)AbstractModuleClient::sendStimulationStopSlot);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar12,"sendStimulationStopGroup",
                          (first_type)AbstractModuleClient::sendStimulationStopGroup);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(GlobalStimulationSettings)>
                         (pcVar12,"sendGlobalStimulationSettings",
                          (first_type)AbstractModuleClient::sendGlobalStimulationSettings);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(GlobalStimulationCommand)>
                         (pcVar12,"sendGlobalStimulationCommand",
                          (first_type)AbstractModuleClient::sendGlobalStimulationCommand);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar12,"sendStateScriptShortcutMessage",
                          (first_type)AbstractModuleClient::sendStateScriptShortcutMessage);
  pcVar12 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<unsigned_int(AbstractModuleClient::*)()>
                         (pcVar12,"latestTrodesTimestamp",
                          (first_type)AbstractModuleClient::latestTrodesTimestamp);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(std::__cxx11::string)>
            (pcVar12,"sendAnnotationRequest",(first_type)AbstractModuleClient::sendAnnotationRequest
            );
  *local_a8 = *local_a8 + -1;
  if (*local_a8 == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

BOOST_PYTHON_MODULE(trodesnetwork){
    PyEval_InitThreads();
    Py_Initialize();
    np::initialize();
    to_python_converter<std::vector<std::string>, vecToList<std::string> >();
    to_python_converter<std::vector<byte>, vecToList<byte> >();
    to_python_converter<std::vector<int>, vecToList<int> >();
    to_python_converter<std::vector<EventDataType>, EventVecToDict>();
    to_python_converter<std::vector<HighFreqDataType>, vecToList<HighFreqDataType> >();
    to_python_converter<TrodesMsg, TrodesMsgToList>();
    to_python_converter<lfpPacket, lfpPacketToList>();

    scope().attr("TRODES_NETWORK_ID") = TRODES_NETWORK_ID;
    scope().attr("DEFAULT_SERVER_ADDRESS") = DEFAULT_SERVER_ADDRESS;
    scope().attr("DEFAULT_SERVER_PORT") = DEFAULT_SERVER_PORT;
    scope().attr("NEURALSTREAM") = hfType_NEURO;
    scope().attr("ANALOGSTREAM") = hfType_ANALOG;
    scope().attr("DIGITALSTREAM") = hfType_DIGITAL;
    scope().attr("SPIKESTREAM") = hfType_SPIKE;
    scope().attr("LFPSTREAM") = hfType_LFP;
    scope().attr("acq_PLAY") = acq_PLAY;
    scope().attr("acq_STOP") = acq_STOP;
    scope().attr("acq_PAUSE") = acq_PAUSE;
    scope().attr("acq_SEEK") = acq_SEEK;

//    scope().attr("settle_CMD") = settle_CMD;

    class_<timestamp_t>("timestamp_t")
            .add_property("trodes_timestamp", &timestamp_t::trodes_timestamp)
            .add_property("system_timestamp", &timestamp_t::system_timestamp)
            ;
    def("systemTimeMSecs", &CZHelp::systemTimeMSecs);

    class_<HighFreqDataType>
            ("HighFreqDataType")
            .add_property("name", &HighFreqDataType::getName, &HighFreqDataType::setName)
            .add_property("origin", &HighFreqDataType::getOrigin, &HighFreqDataType::setOrigin)
            .add_property("dataFormat", &HighFreqDataType::getDataFormat, &HighFreqDataType::setDataFormat)
            .add_property("address", &HighFreqDataType::getSockAddr, &HighFreqDataType::setSockAddr)
            .add_property("byteSize", &HighFreqDataType::getByteSize, &HighFreqDataType::setByteSize)
            .def("isValid", &HighFreqDataType::isValid)
            .def("print", &HighFreqDataType::print)
            ;

    class_<StimulationCommand>
            ("StimulationCommand", init<>())
//            .def(init<int, int, int, uint16_t, uint8_t, uint16_t, uint8_t, uint16_t, uint16_t, uint16_t>())
            .def("setGroup", &StimulationCommand::setGroup)
            .def("setNoGroup", &StimulationCommand::setNoGroup)
            .def("setSlot", &StimulationCommand::setSlot)
            .def("setChannels",&StimulationCommand::setChannels)
            .def("setBiphasicPulseShape", &StimulationCommand::setBiphasicPulseShape)
            .def("setNumPulsesInTrain", &StimulationCommand::setNumPulsesInTrain)
            .def("isValid", &StimulationCommand::isValid)
            ;

    enum_<GlobalStimulationSettings::CurrentScaling>("CurrentScaling")
            .value("max10nA", GlobalStimulationSettings::max10nA)
            .value("max20nA", GlobalStimulationSettings::max20nA)
            .value("max50nA", GlobalStimulationSettings::max50nA)
            .value("max100nA", GlobalStimulationSettings::max100nA)
            .value("max200nA", GlobalStimulationSettings::max200nA)
            .value("max500nA", GlobalStimulationSettings::max500nA)
            .value("max1uA", GlobalStimulationSettings::max1uA)
            .value("max2uA", GlobalStimulationSettings::max2uA)
            .value("max5uA", GlobalStimulationSettings::max5uA)
            .value("max10uA", GlobalStimulationSettings::max10uA)
            ;

    class_<GlobalStimulationSettings>("GlobalStimulationSettings", init<>())
            .def("setVoltageScale", &GlobalStimulationSettings::setVoltageScale)
            ;

    class_<GlobalStimulationCommand>("GlobalStimulationCommand", init<>())
            .def("setStimEnabled", &GlobalStimulationCommand::setStimEnabled)
            .def("setResetSequencer", &GlobalStimulationCommand::setResetSequencer)
            .def("setAbortStimulation", &GlobalStimulationCommand::setAbortStimulation)
            .def("setClearDSPOffset", &GlobalStimulationCommand::setClearDSPOffset)
            ;
//    void (HighFreqPub::*pubdatax2)(void, size_t) = &HighFreqPub::publishData;
//    void (HighFreqPub::*pubdatax3)(void, size_t, int64_t) = &HighFreqPub::publishData;
//    class_<HighFreqPub, boost::noncopyable>
//            ("HighFreqPub")
//            .def("initialize", &HighFreqPub::initialize)
//            .def("publishData", pubdatax2)
//            .def("publishData", pubdatax3)
//            .def("getAddress", &HighFreqPub::getAddress)
//            ;

    class_<HFSubConsumer_python, boost::noncopyable>
            ("HFSubConsumer", init<HighFreqDataType, int>())
            .def("initialize", &HFSubConsumer_python::initialize)
            .def("readData", static_cast<size_t (HFSubConsumer::*)(np::ndarray)>(&HFSubConsumer_python::readData_python))
            .def("available", &HFSubConsumer_python::available)
            .def("getDataType", &HFSubConsumer_python::getType)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            ;

    class_<HFParsingInfo>("HFParsingInfo")
            .def_readwrite("indices", &HFParsingInfo::indices)
            .def_readwrite("sizeOf", &HFParsingInfo::sizeOf)
            ;

    class_<LFPConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("LFPConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &LFPConsumer_python::initialize)
            .def("getData", &LFPConsumer_python::getData_python)
            .def("available", &LFPConsumer_python::available)
            .def("create_numpy_array", &LFPConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &LFPConsumer_python::getNTrodesRequested)
            ;

    class_<SpikesConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("SpikesConsumer", init<HighFreqDataType, int, HFParsingInfo, int>())
            .def("initialize", &SpikesConsumer_python::initialize)
            .def("getData",&SpikesConsumer_python::getData_python)
            .def("available", &SpikesConsumer_python::available)
            .def("create_numpy_array", &SpikesConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &SpikesConsumer_python::getNTrodesRequested)
            ;

    class_<AnalogConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &AnalogConsumer_python::initialize)
            .def("getData",&AnalogConsumer_python::getData_python)
            .def("available", &AnalogConsumer_python::available)
            .def("create_numpy_array", &AnalogConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &AnalogConsumer::getChannelsRequested)
            ;

    class_<DigitalConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &DigitalConsumer_python::initialize)
            .def("getData",&DigitalConsumer_python::getData_python)
            .def("available", &DigitalConsumer_python::available)
            .def("create_numpy_array", &DigitalConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &DigitalConsumer::getChannelsRequested)
            ;

    class_<NeuralConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("NeuralConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &NeuralConsumer_python::initialize)
            .def("getData",&NeuralConsumer_python::getData_python)
            .def("available", &NeuralConsumer_python::available)
            .def("create_numpy_array", &NeuralConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &NeuralConsumer::getChannelsRequested)
            ;

    class_<PythonModuleClient, boost::noncopyable>
        ("AbstractModuleClient", init<std::string, std::string, int>())
        .def("closeConnections", &PythonModuleClient::close_python)
        .def("recv_acquisition", &AbstractModuleClient::recv_acquisition,&PythonModuleClient::default_recv_acquisition)
        .def("recv_file_open", &AbstractModuleClient::recv_file_open,&PythonModuleClient::default_recv_file_open)
        .def("recv_file_close", &AbstractModuleClient::recv_file_close,&PythonModuleClient::default_recv_file_close)
        .def("recv_source", &AbstractModuleClient::recv_source,&PythonModuleClient::default_recv_source)
        .def("recv_quit", &AbstractModuleClient::recv_quit,&PythonModuleClient::default_recv_quit)
        .def("recv_time", &AbstractModuleClient::recv_time,&PythonModuleClient::default_recv_time)
        .def("recv_timerate", &AbstractModuleClient::recv_timerate,&PythonModuleClient::default_recv_timerate)
        .def("recv_event", &AbstractModuleClient::recv_event,&PythonModuleClient::default_recv_event)
        .def("initialize", &PythonModuleClient::initialize)
        .def("subscribeToEvent", &PythonModuleClient::subscribeToEvent)
        .def("unsubscribeFromEvent", &PythonModuleClient::unsubscribeFromEvent)
        .def("sendMsgToTrodes", &PythonModuleClient::sendMsgToTrodes_python)
        .def("sendMsgToModule", &PythonModuleClient::sendMsgToModule_python)
        .def("sendOutEvent", &PythonModuleClient::sendOutEvent_python)
        .def("sendTimeRequest", &PythonModuleClient::sendTimeRequest)
        .def("sendTimeRateRequest", &PythonModuleClient::sendTimeRateRequest)
        .def("getID", &PythonModuleClient::getID)
        .def("getClients", &PythonModuleClient::getClients)
        .def("registerHighFreqData", &PythonModuleClient::registerHighFreqData)
        .def("deregisterHighFreqData", &PythonModuleClient::deregisterHighFreqData)
        .def("getHighFreqList", &PythonModuleClient::getHighFreqList)
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_python, return_value_policy<manage_new_object>())
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_default_python, return_value_policy<manage_new_object>())
        .def("unsubscribeHighFreqData", &PythonModuleClient::unsubscribeHighFreqData)
        .def("provideEvent", &PythonModuleClient::provideEvent)
        .def("unprovideEvent",&PythonModuleClient::unprovideEvent)
        .def("getEventList", &PythonModuleClient::getEventList)
        .def("subscribeLFPData", &PythonModuleClient::sublfpdata_python, return_value_policy<manage_new_object>())
        .def("subscribeSpikesData", &PythonModuleClient::subspikesdata_python, return_value_policy<manage_new_object>())
        .def("subscribeAnalogData", &PythonModuleClient::subanalogdata_python, return_value_policy<manage_new_object>())
        .def("subscribeDigitalData", &PythonModuleClient::subdigitaldata_python, return_value_policy<manage_new_object>())
        .def("subscribeNeuralData", &PythonModuleClient::subneuraldata_python, return_value_policy<manage_new_object>())
        .def("getAvailableTrodesData", &PythonModuleClient::getAvailableTrodesData)
        .def("initializeHardwareConnection", &PythonModuleClient::initializeHardwareConnection)
        .def("destroyHardwareConnection", &PythonModuleClient::destroyHardwareConnection)
        .def("sendSettleCommand", &PythonModuleClient::sendSettleCommand)
        .def("sendStimulationParams", &PythonModuleClient::sendStimulationParams)
        .def("sendClearStimulationParams", &PythonModuleClient::sendClearStimulationParams)
        .def("sendStimulationStartSlot", &PythonModuleClient::sendStimulationStartSlot)
        .def("sendStimulationStartGroup",&PythonModuleClient::sendStimulationStartGroup)
        .def("sendStimulationStopSlot", &PythonModuleClient::sendStimulationStopSlot)
        .def("sendStimulationStopGroup",&PythonModuleClient::sendStimulationStopGroup)
        .def("sendGlobalStimulationSettings", &PythonModuleClient::sendGlobalStimulationSettings)
        .def("sendGlobalStimulationCommand", &PythonModuleClient::sendGlobalStimulationCommand)
        .def("sendStateScriptShortcutMessage", &PythonModuleClient::sendStateScriptShortcutMessage)
        .def("latestTrodesTimestamp", &PythonModuleClient::latestTrodesTimestamp)
        .def("sendAnnotationRequest", &PythonModuleClient::sendAnnotationRequest)
        ;
}